

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O2

void __thiscall
trompeloeil::call_matcher_list<float_&(float_&)>::~call_matcher_list
          (call_matcher_list<float_&(float_&)> *this)

{
  list<trompeloeil::call_matcher_base<float_&(float_&)>,_trompeloeil::ignore_disposer>::~list
            (&this->
              super_list<trompeloeil::call_matcher_base<float_&(float_&)>,_trompeloeil::ignore_disposer>
            );
  operator_delete(this,0x18);
  return;
}

Assistant:

void decommission()
    {
      auto lock = get_lock();
      auto iter = this->begin();
      auto const e = this->end();
      while (iter != e)
      {
        auto &m = *iter;
        ++iter; // intrusive list, so must advance to next before destroying
        m.mock_destroyed();
        m.unlink();
      }
    }